

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::Client::read_response_line(Client *this,Stream *strm,Response *res)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *__s;
  const_reference pvVar4;
  FILE *__stream;
  size_t *__n;
  string_type local_8e8;
  string_type local_8c8;
  undefined1 local_8a8 [8];
  cmatch m;
  undefined1 local_878 [8];
  stream_line_reader reader;
  char buf [2048];
  int bufsiz;
  Response *res_local;
  Stream *strm_local;
  Client *this_local;
  
  __stream = (FILE *)0x800;
  detail::stream_line_reader::stream_line_reader
            ((stream_line_reader *)local_878,strm,reader.glowable_buffer_.field_2._M_local_buf + 8,
             0x800);
  uVar3 = detail::stream_line_reader::getline
                    ((stream_line_reader *)local_878,(char **)strm,__n,__stream);
  if ((uVar3 & 1) == 0) {
    this_local._7_1_ = false;
    m._M_begin._0_4_ = 1;
  }
  else {
    if ((read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&read_response_line(httplib::Stream&,httplib::Response&)::
                                     re_abi_cxx11_), iVar2 != 0)) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_,
                 "(HTTP/1\\.[01]) (\\d+?) .+\r\n",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_);
    }
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
    match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)local_8a8);
    __s = detail::stream_line_reader::ptr((stream_line_reader *)local_878);
    bVar1 = std::
            regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
                      (__s,(match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            *)local_8a8,
                       &read_response_line(httplib::Stream&,httplib::Response&)::re_abi_cxx11_,0);
    if (bVar1) {
      pvVar4 = std::__cxx11::
               match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             *)local_8a8,1);
      std::__cxx11::sub_match::operator_cast_to_string(&local_8c8,(sub_match *)pvVar4);
      std::__cxx11::string::operator=((string *)res,(string *)&local_8c8);
      std::__cxx11::string::~string((string *)&local_8c8);
      pvVar4 = std::__cxx11::
               match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             *)local_8a8,2);
      std::__cxx11::sub_match::operator_cast_to_string(&local_8e8,(sub_match *)pvVar4);
      iVar2 = std::__cxx11::stoi(&local_8e8,(size_t *)0x0,10);
      res->status = iVar2;
      std::__cxx11::string::~string((string *)&local_8e8);
    }
    this_local._7_1_ = true;
    m._M_begin._0_4_ = 1;
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
    ~match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    *)local_8a8);
  }
  detail::stream_line_reader::~stream_line_reader((stream_line_reader *)local_878);
  return this_local._7_1_;
}

Assistant:

inline bool Client::read_response_line(Stream& strm, Response& res)
{
    const auto bufsiz = 2048;
    char buf[bufsiz];

    detail::stream_line_reader reader(strm, buf, bufsiz);

    if (!reader.getline()) {
        return false;
    }

    const static std::regex re("(HTTP/1\\.[01]) (\\d+?) .+\r\n");

    std::cmatch m;
    if (std::regex_match(reader.ptr(), m, re)) {
        res.version = std::string(m[1]);
        res.status = std::stoi(std::string(m[2]));
    }

    return true;
}